

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_fit(REF_INT degree,REF_INT n_control_point,REF_DBL *t,REF_DBL *uv,REF_DBL *bundle)

{
  int rows_00;
  int cols_00;
  int iVar1;
  uint uVar2;
  REF_DBL *ab_00;
  REF_DBL *N_00;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT col;
  REF_INT row;
  REF_INT j;
  REF_INT i;
  REF_INT nknot;
  REF_DBL *N;
  REF_DBL *ab;
  REF_INT cols;
  REF_INT rows;
  REF_DBL *bundle_local;
  REF_DBL *uv_local;
  REF_DBL *t_local;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  rows_00 = n_control_point * 2;
  cols_00 = n_control_point * 2 + 1;
  iVar1 = n_control_point + degree + 1;
  for (row = 0; row < iVar1; row = row + 1) {
    bundle[row] = -1.0;
  }
  for (row = 0; row < degree + 1; row = row + 1) {
    bundle[row] = *t;
  }
  for (col = 1; col <= (n_control_point - degree) + -1; col = col + 1) {
    bundle[col + degree] = 0.0;
    for (row = col; row <= col + degree + -1; row = row + 1) {
      bundle[col + degree] = t[row] / (double)degree + bundle[col + degree];
    }
  }
  for (row = 0; row < degree + 1; row = row + 1) {
    bundle[row + n_control_point] = t[n_control_point + -1];
  }
  if (rows_00 * cols_00 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x111f,
           "ref_geom_bspline_fit","malloc ab of REF_DBL negative");
    n_control_point_local = 1;
  }
  else {
    ab_00 = (REF_DBL *)malloc((long)(rows_00 * cols_00) << 3);
    if (ab_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x111f
             ,"ref_geom_bspline_fit","malloc ab of REF_DBL NULL");
      n_control_point_local = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < rows_00 * cols_00;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        ab_00[ref_private_macro_code_rss_1] = 0.0;
      }
      if (n_control_point < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1120,"ref_geom_bspline_fit","malloc N of REF_DBL negative");
        n_control_point_local = 1;
      }
      else {
        N_00 = (REF_DBL *)malloc((long)n_control_point << 3);
        if (N_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1120,"ref_geom_bspline_fit","malloc N of REF_DBL NULL");
          n_control_point_local = 2;
        }
        else {
          for (row = 0; row < n_control_point; row = row + 1) {
            uVar2 = ref_geom_bspline_row(degree,n_control_point,bundle,t[row],N_00);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x1122,"ref_geom_bspline_fit",(ulong)uVar2,"row");
              return uVar2;
            }
            for (col = 0; col < n_control_point; col = col + 1) {
              ab_00[row + col * rows_00] = N_00[col];
            }
            ab_00[row + n_control_point * 2 * rows_00] = uv[row << 1];
            for (col = 0; col < n_control_point; col = col + 1) {
              ab_00[row + n_control_point + (col + n_control_point) * rows_00] = N_00[col];
            }
            ab_00[row + n_control_point + n_control_point * 2 * rows_00] = uv[row * 2 + 1];
          }
          n_control_point_local = ref_matrix_solve_ab(rows_00,cols_00,ab_00);
          if (n_control_point_local == 0) {
            for (row = 0; row < n_control_point; row = row + 1) {
              bundle[row * 2 + iVar1] = ab_00[row + n_control_point * 2 * rows_00];
              bundle[row * 2 + 1 + iVar1] =
                   ab_00[row + n_control_point + n_control_point * 2 * rows_00];
            }
            if (N_00 != (REF_DBL *)0x0) {
              free(N_00);
            }
            if (ab_00 != (REF_DBL *)0x0) {
              free(ab_00);
            }
            n_control_point_local = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1135,"ref_geom_bspline_fit",(ulong)(uint)n_control_point_local,"solve");
          }
        }
      }
    }
  }
  return n_control_point_local;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_fit(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *t, REF_DBL *uv,
                                        REF_DBL *bundle) {
  REF_INT rows = 2 * n_control_point;
  REF_INT cols = 2 * n_control_point + 1;
  REF_DBL *ab;
  REF_DBL *N;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  REF_INT i, j;
  REF_INT row, col;

  for (i = 0; i < nknot; i++) {
    bundle[i] = -1.0;
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i] = t[0];
  }
  for (j = 1; j <= ref_geom_bspline_n(degree, n_control_point) - degree; j++) {
    bundle[j + degree] = 0.0;
    for (i = j; i <= j + degree - 1; i++)
      bundle[j + degree] += t[i] / ((REF_DBL)degree);
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i + n_control_point] = t[n_control_point - 1];
  }
  ref_malloc_init(ab, rows * cols, REF_DBL, 0.0);
  ref_malloc(N, n_control_point, REF_DBL);
  for (i = 0; i < n_control_point; i++) {
    RSS(ref_geom_bspline_row(degree, n_control_point, bundle, t[i], N), "row");
    for (j = 0; j < n_control_point; j++) {
      row = i;
      col = j;
      ab[row + col * rows] = N[j];
    }
    row = i;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[0 + 2 * i];
    for (j = 0; j < n_control_point; j++) {
      row = i + n_control_point;
      col = j + n_control_point;
      ab[row + col * rows] = N[j];
    }
    row = i + n_control_point;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[1 + 2 * i];
  }

  RSS(ref_matrix_solve_ab(rows, cols, ab), "solve");
  for (i = 0; i < n_control_point; i++) {
    row = i;
    col = 2 * n_control_point;
    bundle[0 + 2 * i + nknot] = ab[row + col * rows];
    row = i + n_control_point;
    col = 2 * n_control_point;
    bundle[1 + 2 * i + nknot] = ab[row + col * rows];
  }
  ref_free(N);
  ref_free(ab);
  return REF_SUCCESS;
}